

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

wstring * __thiscall
booster::locale::basic_message<wchar_t>::str_abi_cxx11_
          (basic_message<wchar_t> *this,locale *loc,int id)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  uint in_ECX;
  int in_EDX;
  basic_message<wchar_t> *in_RSI;
  wstring *in_RDI;
  char_type_conflict *ptr;
  string_type *buffer;
  
  std::__cxx11::wstring::wstring(in_RDI);
  pwVar1 = (wchar_t *)write(in_RSI,in_EDX,(void *)(ulong)in_ECX,(size_t)in_RDI);
  pwVar2 = (wchar_t *)std::__cxx11::wstring::c_str();
  if (pwVar1 != pwVar2) {
    std::__cxx11::wstring::operator=(in_RDI,pwVar1);
  }
  return in_RDI;
}

Assistant:

string_type str(std::locale const &loc,int id) const
            {
                string_type buffer;                
                char_type const *ptr = write(loc,id,buffer);
                if(ptr == buffer.c_str())
                    return buffer;
                else
                    buffer = ptr;
                return buffer;
            }